

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_flow_collection_start(yaml_parser_t *parser,yaml_token_type_t type)

{
  yaml_simple_key_t **top;
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  yaml_simple_key_t *pyVar11;
  yaml_token_t *pyVar12;
  long lVar13;
  yaml_mark_t start_mark;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  
  iVar10 = yaml_parser_save_simple_key(parser);
  if (iVar10 == 0) {
    return 0;
  }
  pyVar11 = (parser->simple_keys).top;
  if (pyVar11 == (parser->simple_keys).end) {
    top = &(parser->simple_keys).top;
    iVar10 = yaml_stack_extend(&(parser->simple_keys).start,top,&(parser->simple_keys).end);
    if (iVar10 == 0) goto LAB_0010ec65;
    pyVar11 = *top;
  }
  (parser->simple_keys).top = pyVar11 + 1;
  (pyVar11->mark).index = 0;
  (pyVar11->mark).line = 0;
  pyVar11->possible = 0;
  pyVar11->required = 0;
  pyVar11->token_number = 0;
  (pyVar11->mark).column = 0;
  if (parser->flow_level == 0x7fffffff) {
LAB_0010ec65:
    parser->error = YAML_MEMORY_ERROR;
    return 0;
  }
  parser->flow_level = parser->flow_level + 1;
  parser->simple_key_allowed = 1;
  sVar3 = (parser->mark).column;
  sVar6 = (parser->mark).index;
  sVar7 = (parser->mark).line;
  (parser->mark).index = (parser->mark).index + 1;
  psVar1 = &(parser->mark).column;
  *psVar1 = *psVar1 + 1;
  parser->unread = parser->unread - 1;
  pbVar4 = (parser->buffer).pointer;
  bVar2 = *pbVar4;
  lVar13 = 1;
  if ((((char)bVar2 < '\0') && (lVar13 = 2, (bVar2 & 0xe0) != 0xc0)) &&
     (lVar13 = 3, (bVar2 & 0xf0) != 0xe0)) {
    lVar13 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar4 + lVar13;
  sVar5 = (parser->mark).column;
  sVar8 = (parser->mark).index;
  sVar9 = (parser->mark).line;
  local_2c = (undefined4)sVar3;
  uStack_28 = (undefined4)(sVar3 >> 0x20);
  uStack_38 = (undefined4)(sVar6 >> 0x20);
  uStack_34 = (undefined4)sVar7;
  uStack_30 = (undefined4)(sVar7 >> 0x20);
  tail = &(parser->tokens).tail;
  pyVar12 = (parser->tokens).tail;
  if (pyVar12 == (parser->tokens).end) {
    iVar10 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                               &(parser->tokens).end);
    if (iVar10 == 0) goto LAB_0010ec65;
    pyVar12 = *tail;
  }
  *tail = pyVar12 + 1;
  pyVar12->type = type;
  *(undefined8 *)&pyVar12->field_0x4 = 0;
  *(undefined8 *)((long)&(pyVar12->data).alias.value + 4) = 0;
  *(undefined8 *)((long)&(pyVar12->data).tag.suffix + 4) = 0;
  *(size_t *)((long)&pyVar12->data + 0x14) = sVar6 << 0x20;
  *(ulong *)((long)&(pyVar12->start_mark).index + 4) = CONCAT44(uStack_34,uStack_38);
  *(ulong *)((long)&(pyVar12->start_mark).line + 4) = CONCAT44(local_2c,uStack_30);
  *(undefined4 *)((long)&(pyVar12->start_mark).column + 4) = uStack_28;
  (pyVar12->end_mark).index = sVar8;
  (pyVar12->end_mark).line = sVar9;
  (pyVar12->end_mark).column = sVar5;
  return 1;
}

Assistant:

static int
yaml_parser_fetch_flow_collection_start(yaml_parser_t *parser,
        yaml_token_type_t type)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* The indicators '[' and '{' may start a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* Increase the flow level. */

    if (!yaml_parser_increase_flow_level(parser))
        return 0;

    /* A simple key may follow the indicators '[' and '{'. */

    parser->simple_key_allowed = 1;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the FLOW-SEQUENCE-START of FLOW-MAPPING-START token. */

    TOKEN_INIT(token, type, start_mark, end_mark);

    /* Append the token to the queue. */

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}